

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTests.cpp
# Opt level: O2

void __thiscall ParserTest_UnaryLogical_Test::TestBody(ParserTest_UnaryLogical_Test *this)

{
  _Alloc_hider _Var1;
  pointer *__ptr;
  _Head_base<0UL,_NumericLiteralNode_*,_false> local_e8;
  long *local_e0;
  unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_> local_d4;
  undefined4 uStack_cc;
  unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> local_c8;
  string local_c0;
  undefined4 local_9c;
  __uniq_ptr_impl<Node,_std::default_delete<Node>_> local_98;
  __uniq_ptr_impl<Node,_std::default_delete<Node>_> local_90;
  __uniq_ptr_impl<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> local_88;
  code *local_80 [2];
  code *local_70;
  code *local_68;
  code *local_60 [2];
  code *local_50;
  code *local_48;
  code *local_40 [2];
  code *local_30;
  code *local_28;
  
  local_d4._M_t.super___uniq_ptr_impl<BinaryOpNode,_std::default_delete<BinaryOpNode>_>._M_t.
  super__Tuple_impl<0UL,_BinaryOpNode_*,_std::default_delete<BinaryOpNode>_>.
  super__Head_base<0UL,_BinaryOpNode_*,_false>._M_head_impl._4_4_ = 2;
  std::make_unique<NumericLiteralNode,int>((int *)&local_e8);
  local_d4._M_t.super___uniq_ptr_impl<BinaryOpNode,_std::default_delete<BinaryOpNode>_>._M_t.
  super__Tuple_impl<0UL,_BinaryOpNode_*,_std::default_delete<BinaryOpNode>_>.
  super__Head_base<0UL,_BinaryOpNode_*,_false>._M_head_impl._0_4_ = 0xc;
  local_c8._M_t.super___uniq_ptr_impl<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>.
  _M_t.super__Tuple_impl<0UL,_NumericLiteralNode_*,_std::default_delete<NumericLiteralNode>_>.
  super__Head_base<0UL,_NumericLiteralNode_*,_false>._M_head_impl._4_4_ = 3;
  std::make_unique<NumericLiteralNode,int>((int *)&local_e0);
  std::
  make_unique<BinaryOpNode,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>,BinaryOperator,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>>
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)&local_c0,
             (BinaryOperator *)&local_e8,
             (unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)&local_d4);
  _Var1._M_p = local_c0._M_dataplus._M_p;
  local_c0._M_dataplus._M_p = (pointer)0x0;
  if (local_e0 != (long *)0x0) {
    (**(code **)(*local_e0 + 8))();
  }
  if (local_e8._M_head_impl != (NumericLiteralNode *)0x0) {
    (*((local_e8._M_head_impl)->super_ExpressionNode).super_Node._vptr_Node[1])();
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"(2 > 3)",(allocator<char> *)&local_e8);
  local_40[0] = Parser::parseUnaryLogical;
  local_40[1] = (code *)0x0;
  local_28 = std::
             _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*)()>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*)()>
             ::_M_manager;
  local_90._M_t.super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
  super__Head_base<0UL,_Node_*,_false>._M_head_impl =
       (tuple<Node_*,_std::default_delete<Node>_>)
       (tuple<Node_*,_std::default_delete<Node>_>)_Var1._M_p;
  setupTest(&local_c0,
            (function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *)local_40,
            (unique_ptr<Node,_std::default_delete<Node>_> *)&local_90);
  if ((long *)_Var1._M_p != (long *)0x0) {
    (**(code **)(*(long *)_Var1._M_p + 8))(_Var1._M_p);
  }
  local_90._M_t.super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
  super__Head_base<0UL,_Node_*,_false>._M_head_impl =
       (tuple<Node_*,_std::default_delete<Node>_>)
       (_Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>)0x0;
  std::_Function_base::~_Function_base((_Function_base *)local_40);
  std::__cxx11::string::~string((string *)&local_c0);
  local_d4._M_t.super___uniq_ptr_impl<BinaryOpNode,_std::default_delete<BinaryOpNode>_>._M_t.
  super__Tuple_impl<0UL,_BinaryOpNode_*,_std::default_delete<BinaryOpNode>_>.
  super__Head_base<0UL,_BinaryOpNode_*,_false>._M_head_impl._0_4_ = 2;
  local_c8._M_t.super___uniq_ptr_impl<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>.
  _M_t.super__Tuple_impl<0UL,_NumericLiteralNode_*,_std::default_delete<NumericLiteralNode>_>.
  super__Head_base<0UL,_NumericLiteralNode_*,_false>._M_head_impl._4_4_ =
       local_d4._M_t.super___uniq_ptr_impl<BinaryOpNode,_std::default_delete<BinaryOpNode>_>._M_t.
       super__Tuple_impl<0UL,_BinaryOpNode_*,_std::default_delete<BinaryOpNode>_>.
       super__Head_base<0UL,_BinaryOpNode_*,_false>._M_head_impl._0_4_;
  std::make_unique<NumericLiteralNode,int>((int *)&local_e0);
  local_c8._M_t.super___uniq_ptr_impl<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>.
  _M_t.super__Tuple_impl<0UL,_NumericLiteralNode_*,_std::default_delete<NumericLiteralNode>_>.
  super__Head_base<0UL,_NumericLiteralNode_*,_false>._M_head_impl._0_4_ = 0xc;
  local_9c = 3;
  std::make_unique<NumericLiteralNode,int>
            ((int *)((long)&local_d4._M_t.
                            super___uniq_ptr_impl<BinaryOpNode,_std::default_delete<BinaryOpNode>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_BinaryOpNode_*,_std::default_delete<BinaryOpNode>_>
                            .super__Head_base<0UL,_BinaryOpNode_*,_false>._M_head_impl + 4));
  std::
  make_unique<BinaryOpNode,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>,BinaryOperator,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>>
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)&local_e8,
             (BinaryOperator *)&local_e0,&local_c8);
  std::
  make_unique<UnaryNode,UnaryOperator,std::unique_ptr<BinaryOpNode,std::default_delete<BinaryOpNode>>>
            ((UnaryOperator *)&local_c0,&local_d4);
  _Var1._M_p = local_c0._M_dataplus._M_p;
  local_c0._M_dataplus._M_p = (pointer)0x0;
  if (local_e8._M_head_impl != (NumericLiteralNode *)0x0) {
    (*((local_e8._M_head_impl)->super_ExpressionNode).super_Node._vptr_Node[1])();
  }
  local_e8._M_head_impl = (NumericLiteralNode *)0x0;
  if ((long *)CONCAT44(uStack_cc,
                       local_d4._M_t.
                       super___uniq_ptr_impl<BinaryOpNode,_std::default_delete<BinaryOpNode>_>._M_t.
                       super__Tuple_impl<0UL,_BinaryOpNode_*,_std::default_delete<BinaryOpNode>_>.
                       super__Head_base<0UL,_BinaryOpNode_*,_false>._M_head_impl._4_4_) !=
      (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(uStack_cc,
                                   local_d4._M_t.
                                   super___uniq_ptr_impl<BinaryOpNode,_std::default_delete<BinaryOpNode>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_BinaryOpNode_*,_std::default_delete<BinaryOpNode>_>
                                   .super__Head_base<0UL,_BinaryOpNode_*,_false>._M_head_impl._4_4_)
                + 8))();
  }
  if (local_e0 != (long *)0x0) {
    (**(code **)(*local_e0 + 8))();
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"!(2 > 3)",(allocator<char> *)&local_e8);
  local_60[0] = Parser::parseUnaryLogical;
  local_60[1] = (code *)0x0;
  local_48 = std::
             _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*)()>
             ::_M_invoke;
  local_50 = std::
             _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*)()>
             ::_M_manager;
  local_98._M_t.super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
  super__Head_base<0UL,_Node_*,_false>._M_head_impl =
       (tuple<Node_*,_std::default_delete<Node>_>)
       (tuple<Node_*,_std::default_delete<Node>_>)_Var1._M_p;
  setupTest(&local_c0,
            (function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *)local_60,
            (unique_ptr<Node,_std::default_delete<Node>_> *)&local_98);
  if ((long *)_Var1._M_p != (long *)0x0) {
    (**(code **)(*(long *)_Var1._M_p + 8))(_Var1._M_p);
  }
  local_98._M_t.super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
  super__Head_base<0UL,_Node_*,_false>._M_head_impl =
       (tuple<Node_*,_std::default_delete<Node>_>)
       (_Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>)0x0;
  std::_Function_base::~_Function_base((_Function_base *)local_60);
  std::__cxx11::string::~string((string *)&local_c0);
  local_d4._M_t.super___uniq_ptr_impl<BinaryOpNode,_std::default_delete<BinaryOpNode>_>._M_t.
  super__Tuple_impl<0UL,_BinaryOpNode_*,_std::default_delete<BinaryOpNode>_>.
  super__Head_base<0UL,_BinaryOpNode_*,_false>._M_head_impl._0_4_ = 2;
  local_c8._M_t.super___uniq_ptr_impl<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>.
  _M_t.super__Tuple_impl<0UL,_NumericLiteralNode_*,_std::default_delete<NumericLiteralNode>_>.
  super__Head_base<0UL,_NumericLiteralNode_*,_false>._M_head_impl._4_4_ = 1;
  std::make_unique<NumericLiteralNode,int>((int *)&local_e0);
  local_c8._M_t.super___uniq_ptr_impl<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>.
  _M_t.super__Tuple_impl<0UL,_NumericLiteralNode_*,_std::default_delete<NumericLiteralNode>_>.
  super__Head_base<0UL,_NumericLiteralNode_*,_false>._M_head_impl._0_4_ = 0xe;
  local_9c = 3;
  std::make_unique<NumericLiteralNode,int>
            ((int *)((long)&local_d4._M_t.
                            super___uniq_ptr_impl<BinaryOpNode,_std::default_delete<BinaryOpNode>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_BinaryOpNode_*,_std::default_delete<BinaryOpNode>_>
                            .super__Head_base<0UL,_BinaryOpNode_*,_false>._M_head_impl + 4));
  std::
  make_unique<BinaryOpNode,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>,BinaryOperator,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>>
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)&local_e8,
             (BinaryOperator *)&local_e0,&local_c8);
  std::
  make_unique<UnaryNode,UnaryOperator,std::unique_ptr<BinaryOpNode,std::default_delete<BinaryOpNode>>>
            ((UnaryOperator *)&local_c0,&local_d4);
  _Var1._M_p = local_c0._M_dataplus._M_p;
  local_c0._M_dataplus._M_p = (pointer)0x0;
  if (local_e8._M_head_impl != (NumericLiteralNode *)0x0) {
    (*((local_e8._M_head_impl)->super_ExpressionNode).super_Node._vptr_Node[1])();
  }
  local_e8._M_head_impl = (NumericLiteralNode *)0x0;
  if ((long *)CONCAT44(uStack_cc,
                       local_d4._M_t.
                       super___uniq_ptr_impl<BinaryOpNode,_std::default_delete<BinaryOpNode>_>._M_t.
                       super__Tuple_impl<0UL,_BinaryOpNode_*,_std::default_delete<BinaryOpNode>_>.
                       super__Head_base<0UL,_BinaryOpNode_*,_false>._M_head_impl._4_4_) !=
      (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(uStack_cc,
                                   local_d4._M_t.
                                   super___uniq_ptr_impl<BinaryOpNode,_std::default_delete<BinaryOpNode>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_BinaryOpNode_*,_std::default_delete<BinaryOpNode>_>
                                   .super__Head_base<0UL,_BinaryOpNode_*,_false>._M_head_impl._4_4_)
                + 8))();
  }
  if (local_e0 != (long *)0x0) {
    (**(code **)(*local_e0 + 8))();
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"!1 < 3",(allocator<char> *)&local_e8);
  local_80[0] = Parser::parseUnaryLogical;
  local_80[1] = (code *)0x0;
  local_68 = std::
             _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*)()>
             ::_M_invoke;
  local_70 = std::
             _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*)()>
             ::_M_manager;
  local_88._M_t.
  super__Tuple_impl<0UL,_NumericLiteralNode_*,_std::default_delete<NumericLiteralNode>_>.
  super__Head_base<0UL,_NumericLiteralNode_*,_false>._M_head_impl =
       (tuple<NumericLiteralNode_*,_std::default_delete<NumericLiteralNode>_>)
       (tuple<NumericLiteralNode_*,_std::default_delete<NumericLiteralNode>_>)_Var1._M_p;
  setupTest(&local_c0,
            (function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *)local_80,
            (unique_ptr<Node,_std::default_delete<Node>_> *)&local_88);
  if ((long *)_Var1._M_p != (long *)0x0) {
    (**(code **)(*(long *)_Var1._M_p + 8))(_Var1._M_p);
  }
  std::_Function_base::~_Function_base((_Function_base *)local_80);
  std::__cxx11::string::~string((string *)&local_c0);
  return;
}

Assistant:

TEST(ParserTest, UnaryLogical)
{
  std::unique_ptr<ExpressionNode> node = 
    std::make_unique<BinaryOpNode>(
      std::make_unique<NumericLiteralNode>(2),
      BinaryOperator::Greater,
      std::make_unique<NumericLiteralNode>(3));
  setupTest("(2 > 3)", &Parser::parseUnaryLogical, std::move(node));

  node = 
    std::make_unique<UnaryNode>(
      UnaryOperator::LogicalNot,
      std::make_unique<BinaryOpNode>(
        std::make_unique<NumericLiteralNode>(2),
        BinaryOperator::Greater,
        std::make_unique<NumericLiteralNode>(3)));
  setupTest("!(2 > 3)", &Parser::parseUnaryLogical, std::move(node));

  node = 
    std::make_unique<UnaryNode>(
      UnaryOperator::LogicalNot,
      std::make_unique<BinaryOpNode>(    
        std::make_unique<NumericLiteralNode>(1),
        BinaryOperator::Less,
        std::make_unique<NumericLiteralNode>(3)));
  setupTest("!1 < 3", &Parser::parseUnaryLogical, std::move(node));
}